

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  undefined8 uVar1;
  bool bVar2;
  void *__src;
  undefined4 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
  *__tmp;
  __allocator_type __a2;
  allocator<std::_Sp_counted_ptr_inplace<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>,_std::allocator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>,_(__gnu_cxx::_Lock_policy)2>_>
  local_69;
  undefined4 *local_68;
  undefined8 *local_60;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>,_std::allocator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_58;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  bVar2 = AtEnd(this);
  if (!bVar2) {
    local_60 = (undefined8 *)
               (**(code **)(*(long *)(this->current_).
                                     super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                                     ._M_head_impl.impl_._M_t.
                                     super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                           + 0x28))();
    local_68 = (undefined4 *)
               (**(code **)(*(long *)(this->current_).
                                     super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                     .
                                     super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                     .
                                     super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                                     ._M_head_impl.impl_._M_t.
                                     super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                           + 0x28))();
    __src = (void *)(**(code **)(*(long *)(this->current_).
                                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                          .
                                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                          .
                                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                          .
                                          super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_false>
                                          ._M_head_impl.impl_._M_t.
                                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
                                          .
                                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
                                + 0x28))();
    puVar3 = (undefined4 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>
                                   ._M_head_impl.impl_ + 0x28))();
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x230);
    local_58._M_alloc = &local_69;
    p_Var4->_M_use_count = 1;
    p_Var4->_M_weak_count = 1;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00f04e08;
    *(undefined4 *)&p_Var4[1]._vptr__Sp_counted_base = *puVar3;
    memcpy((void *)((long)&p_Var4[1]._vptr__Sp_counted_base + 4),__src,0x20c);
    *(undefined4 *)&p_Var4[0x22]._vptr__Sp_counted_base = *local_68;
    uVar1 = *local_60;
    p_Var4[0x22]._M_use_count = (int)uVar1;
    p_Var4[0x22]._M_weak_count = (int)((ulong)uVar1 >> 0x20);
    local_58._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>,_std::allocator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_58);
    local_48 = 0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>,_std::allocator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)(this->current_value_).
            super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
    local_58._M_ptr =
         (pointer)(this->current_value_).
                  super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    (this->current_value_).
    super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var4 + 1);
    (this->current_value_).
    super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var4;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }